

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_hdr_copy_fragment(lws *wsi,char *dst,int len,lws_token_indexes h,int frag_idx)

{
  ushort uVar1;
  allocated_headers *paVar2;
  uint uVar3;
  byte bVar4;
  
  paVar2 = (wsi->http).ah;
  uVar3 = 0xffffffff;
  if ((paVar2 != (allocated_headers *)0x0) && (bVar4 = paVar2->frag_index[h], bVar4 != 0)) {
    if (0 < frag_idx) {
      do {
        bVar4 = paVar2->frags[bVar4].nfrag;
        if (bVar4 == 0) {
          return -1;
        }
        frag_idx = frag_idx + -1;
      } while (frag_idx != 0);
    }
    uVar1 = paVar2->frags[bVar4].len;
    if ((int)(uint)uVar1 < len) {
      memcpy(dst,paVar2->data + paVar2->frags[bVar4].offset,(ulong)uVar1);
      dst[((wsi->http).ah)->frags[bVar4].len] = '\0';
      uVar3 = (uint)((wsi->http).ah)->frags[bVar4].len;
    }
  }
  return uVar3;
}

Assistant:

int lws_hdr_copy_fragment(struct lws *wsi, char *dst, int len,
				      enum lws_token_indexes h, int frag_idx)
{
	int n = 0;
	int f;

	if (!wsi->http.ah)
		return -1;

	f = wsi->http.ah->frag_index[h];

	if (!f)
		return -1;

	while (n < frag_idx) {
		f = wsi->http.ah->frags[f].nfrag;
		if (!f)
			return -1;
		n++;
	}

	if (wsi->http.ah->frags[f].len >= len)
		return -1;

	memcpy(dst, wsi->http.ah->data + wsi->http.ah->frags[f].offset,
	       wsi->http.ah->frags[f].len);
	dst[wsi->http.ah->frags[f].len] = '\0';

	return wsi->http.ah->frags[f].len;
}